

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::detail::fixed_static_array<unsigned_int,_256U>::fixed_static_array
          (fixed_static_array<unsigned_int,_256U> *this,uint size_in,undefined4 *value_in)

{
  undefined4 uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  memset(this,0,0x400);
  if (size_in < 0x100) {
    uVar4 = (ulong)(size_in << 2);
    uVar1 = *value_in;
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 4) {
      *(undefined4 *)(this + uVar2) = uVar1;
    }
    for (; uVar4 != 0x400; uVar4 = uVar4 + 4) {
      *(undefined4 *)(this + uVar4) = 0;
    }
  }
  else {
    uVar1 = *value_in;
    for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 4) {
      *(undefined4 *)(this + lVar3) = uVar1;
    }
  }
  return;
}

Assistant:

explicit constexpr fixed_static_array(const size_type      size_in,
                                          const value_type&    value_in = value_type(),
                                                allocator_type alloc_in = allocator_type())
    {
      static_cast<void>(alloc_in);

      if(size_in < static_size())
      {
        detail::fill_unsafe(base_class_type::begin(),     base_class_type::begin() + size_in, value_in);
        detail::fill_unsafe(base_class_type::begin() + size_in, base_class_type::end(),       value_type());
      }
      else
      {
        // Exclude this line from code coverage, even though explicit
        // test cases (search for "result_overshift_is_ok") are known
        // to cover this line.
        detail::fill_unsafe(base_class_type::begin(), base_class_type::end(), value_in); // LCOV_EXCL_LINE
      }
    }